

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O2

bool __thiscall branch_and_reduce_algorithm::dinicDFS(branch_and_reduce_algorithm *this,int v)

{
  int iVar1;
  int iVar2;
  uint v_00;
  pointer piVar3;
  pointer pvVar4;
  bool bVar5;
  pointer piVar6;
  
  do {
    do {
      do {
        piVar3 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar1 = piVar3[v];
        if ((long)iVar1 < 0) goto LAB_0010930c;
        pvVar4 = (this->adj).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar3[v] = iVar1 + -1;
        iVar2 = *(int *)(*(long *)&pvVar4[v].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data + (long)iVar1 * 4);
      } while (-1 < (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar2]);
      piVar6 = (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      v_00 = piVar6[iVar2];
      if ((int)v_00 < 0) goto LAB_001092fd;
      piVar6 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while ((piVar6[v_00] <= piVar6[v]) || (piVar3[v_00] < 0));
    bVar5 = dinicDFS(this,v_00);
  } while (!bVar5);
  piVar6 = (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
LAB_001092fd:
  piVar6[iVar2] = v;
  (this->out).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [v] = iVar2;
LAB_0010930c:
  return -1 < iVar1;
}

Assistant:

bool branch_and_reduce_algorithm::dinicDFS(int v)
{
    while (iter[v] >= 0)
    {
        int u = adj[v][iter[v]--], w = in[u];
        if (x[u] >= 0)
            continue;
        if (w < 0 || (level[v] < level[w] && iter[w] >= 0 && dinicDFS(w)))
        {
            in[u] = v;
            out[v] = u;
            return true;
        }
    }
    return false;
}